

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::find_non_soo<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *this,key_arg<int> *key,size_t hash)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  undefined1 auVar3 [16];
  uint32_t uVar4;
  ulong extraout_RDX;
  ulong uVar5;
  ushort x;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i match;
  ctrl_t cVar9;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  undefined1 auVar10 [16];
  iterator iVar26;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_60;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  undefined1 local_38 [16];
  
  probe(&local_60,(CommonFields *)this,hash);
  pcVar2 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  auVar7 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar7 = pshuflw(auVar7,auVar7,0);
  uVar6 = auVar7._0_4_;
  auVar7._4_4_ = uVar6;
  auVar7._0_4_ = uVar6;
  auVar7._8_4_ = uVar6;
  auVar7._12_4_ = uVar6;
  while( true ) {
    pcVar1 = pcVar2 + local_60.offset_;
    auVar8[0] = -(auVar7[0] == *pcVar1);
    auVar8[1] = -(auVar7[1] == pcVar1[1]);
    auVar8[2] = -(auVar7[2] == pcVar1[2]);
    auVar8[3] = -(auVar7[3] == pcVar1[3]);
    auVar8[4] = -(auVar7[4] == pcVar1[4]);
    auVar8[5] = -(auVar7[5] == pcVar1[5]);
    auVar8[6] = -(auVar7[6] == pcVar1[6]);
    auVar8[7] = -(auVar7[7] == pcVar1[7]);
    auVar8[8] = -(auVar7[8] == pcVar1[8]);
    auVar8[9] = -(auVar7[9] == pcVar1[9]);
    auVar8[10] = -(auVar7[10] == pcVar1[10]);
    auVar8[0xb] = -(auVar7[0xb] == pcVar1[0xb]);
    auVar8[0xc] = -(auVar7[0xc] == pcVar1[0xc]);
    auVar8[0xd] = -(auVar7[0xd] == pcVar1[0xd]);
    auVar8[0xe] = -(auVar7[0xe] == pcVar1[0xe]);
    auVar8[0xf] = -(auVar7[0xf] == pcVar1[0xf]);
    cVar9 = *pcVar1;
    cVar11 = pcVar1[1];
    cVar12 = pcVar1[2];
    cVar13 = pcVar1[3];
    cVar14 = pcVar1[4];
    cVar15 = pcVar1[5];
    cVar16 = pcVar1[6];
    cVar17 = pcVar1[7];
    cVar18 = pcVar1[8];
    cVar19 = pcVar1[9];
    cVar20 = pcVar1[10];
    cVar21 = pcVar1[0xb];
    cVar22 = pcVar1[0xc];
    cVar23 = pcVar1[0xd];
    cVar24 = pcVar1[0xe];
    cVar25 = pcVar1[0xf];
    for (x = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf;
        x != 0; x = x - 1 & x) {
      local_48 = cVar9;
      cStack_47 = cVar11;
      cStack_46 = cVar12;
      cStack_45 = cVar13;
      cStack_44 = cVar14;
      cStack_43 = cVar15;
      cStack_42 = cVar16;
      cStack_41 = cVar17;
      cStack_40 = cVar18;
      cStack_3f = cVar19;
      cStack_3e = cVar20;
      cStack_3d = cVar21;
      cStack_3c = cVar22;
      cStack_3b = cVar23;
      cStack_3a = cVar24;
      cStack_39 = cVar25;
      local_38 = auVar7;
      uVar4 = TrailingZeros<unsigned_short>(x);
      uVar5 = uVar4 + local_60.offset_ & local_60.mask_;
      if (*(int *)((long)(this->settings_).
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.slot_array.p + uVar5 * 0x28) == *key) {
        iVar26 = iterator_at(this,uVar5);
        return iVar26;
      }
      auVar7 = local_38;
      cVar9 = local_48;
      cVar11 = cStack_47;
      cVar12 = cStack_46;
      cVar13 = cStack_45;
      cVar14 = cStack_44;
      cVar15 = cStack_43;
      cVar16 = cStack_42;
      cVar17 = cStack_41;
      cVar18 = cStack_40;
      cVar19 = cStack_3f;
      cVar20 = cStack_3e;
      cVar21 = cStack_3d;
      cVar22 = cStack_3c;
      cVar23 = cStack_3b;
      cVar24 = cStack_3a;
      cVar25 = cStack_39;
    }
    auVar10[0] = -(cVar9 == kEmpty);
    auVar10[1] = -(cVar11 == kEmpty);
    auVar10[2] = -(cVar12 == kEmpty);
    auVar10[3] = -(cVar13 == kEmpty);
    auVar10[4] = -(cVar14 == kEmpty);
    auVar10[5] = -(cVar15 == kEmpty);
    auVar10[6] = -(cVar16 == kEmpty);
    auVar10[7] = -(cVar17 == kEmpty);
    auVar10[8] = -(cVar18 == kEmpty);
    auVar10[9] = -(cVar19 == kEmpty);
    auVar10[10] = -(cVar20 == kEmpty);
    auVar10[0xb] = -(cVar21 == kEmpty);
    auVar10[0xc] = -(cVar22 == kEmpty);
    auVar10[0xd] = -(cVar23 == kEmpty);
    auVar10[0xe] = -(cVar24 == kEmpty);
    auVar10[0xf] = -(cVar25 == kEmpty);
    if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar25 == kEmpty)
    break;
    uVar5 = local_60.index_ + 0x10;
    local_60.offset_ = local_60.offset_ + local_60.index_ + 0x10 & local_60.mask_;
    local_60.index_ = uVar5;
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < uVar5) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>, K = int]"
                   );
    }
  }
  AssertNotDebugCapacity(this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = extraout_RDX;
  return (iterator)(auVar3 << 0x40);
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }